

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Constr.c
# Opt level: O0

DdManager * Llb_ManConstructGlobalBdds(Aig_Man_t *p)

{
  void *pvVar1;
  uint numVars;
  int iVar2;
  int iVar3;
  DdManager *unique;
  Aig_Obj_t *pAVar4;
  DdNode *pDVar5;
  void *pvVar6;
  Aig_Obj_t *pAVar7;
  int local_34;
  int i;
  Aig_Obj_t *pObj;
  DdNode *bBdd1;
  DdNode *bBdd0;
  DdManager *dd;
  Aig_Man_t *p_local;
  
  numVars = Aig_ManCiNum(p);
  unique = Cudd_Init(numVars,0,0x100,0x40000,0);
  Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
  pAVar4 = Aig_ManConst1(p);
  pDVar5 = Cudd_ReadOne(unique);
  (pAVar4->field_5).pData = pDVar5;
  Cudd_Ref((DdNode *)(pAVar4->field_5).pData);
  for (local_34 = 0; iVar2 = Vec_PtrSize(p->vCis), local_34 < iVar2; local_34 = local_34 + 1) {
    pvVar6 = Vec_PtrEntry(p->vCis,local_34);
    pDVar5 = Cudd_bddIthVar(unique,local_34);
    *(DdNode **)((long)pvVar6 + 0x28) = pDVar5;
    Cudd_Ref(*(DdNode **)((long)pvVar6 + 0x28));
  }
  for (local_34 = 0; iVar2 = Vec_PtrSize(p->vObjs), local_34 < iVar2; local_34 = local_34 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_34);
    if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar4), iVar2 != 0)) {
      pAVar7 = Aig_ObjFanin0(pAVar4);
      pvVar6 = (pAVar7->field_5).pData;
      iVar2 = Aig_ObjFaninC0(pAVar4);
      pAVar7 = Aig_ObjFanin1(pAVar4);
      pvVar1 = (pAVar7->field_5).pData;
      iVar3 = Aig_ObjFaninC1(pAVar4);
      pDVar5 = Cudd_bddAnd(unique,(DdNode *)((ulong)pvVar6 ^ (long)iVar2),
                           (DdNode *)((ulong)pvVar1 ^ (long)iVar3));
      (pAVar4->field_5).pData = pDVar5;
      Cudd_Ref((DdNode *)(pAVar4->field_5).pData);
    }
  }
  for (local_34 = 0; iVar2 = Vec_PtrSize(p->vCos), local_34 < iVar2; local_34 = local_34 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_34);
    pAVar7 = Aig_ObjFanin0(pAVar4);
    pvVar6 = (pAVar7->field_5).pData;
    iVar2 = Aig_ObjFaninC0(pAVar4);
    (pAVar4->field_5).pData = (void *)((ulong)pvVar6 ^ (long)iVar2);
    Cudd_Ref((DdNode *)(pAVar4->field_5).pData);
  }
  return unique;
}

Assistant:

DdManager * Llb_ManConstructGlobalBdds( Aig_Man_t * p )
{
    DdManager * dd;
    DdNode * bBdd0, * bBdd1;
    Aig_Obj_t * pObj;
    int i;
    dd = Cudd_Init( Aig_ManCiNum(p), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( dd,  CUDD_REORDER_SYMM_SIFT );
    pObj = Aig_ManConst1(p);
    pObj->pData = Cudd_ReadOne(dd);  Cudd_Ref( (DdNode *)pObj->pData );
    Aig_ManForEachCi( p, pObj, i )
    {
        pObj->pData = Cudd_bddIthVar(dd, i);  Cudd_Ref( (DdNode *)pObj->pData );
    }
    Aig_ManForEachNode( p, pObj, i )
    {
        bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bBdd1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
        pObj->pData = Cudd_bddAnd( dd, bBdd0, bBdd1 );   Cudd_Ref( (DdNode *)pObj->pData );
    }
    Aig_ManForEachCo( p, pObj, i )
    {
        pObj->pData = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );  Cudd_Ref( (DdNode *)pObj->pData );
    }
    return dd;
}